

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::TokenizeFormat(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  string_view src;
  string sStack_48;
  FormatSpec<std::__cxx11::basic_string<char>_> local_28;
  
  lVar1 = (*(long **)this)[1];
  if (**(long **)this == lVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"wrong number of variable delimiters",
               (allocator<char> *)&sStack_48);
  }
  else {
    local_28.super_type.spec_.data_ = "unclosed variable name: `%s`";
    local_28.super_type.spec_.size_ = 0x1c;
    src._M_str = "unclosed variable name: `%s`";
    src._M_len = *(size_t *)(lVar1 + -0x10);
    CHexEscape_abi_cxx11_(&sStack_48,*(lts_20250127 **)(lVar1 + -0x18),src);
    StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (__return_storage_ptr__,&local_28,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}